

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_cwksp *pZVar1;
  void *__s;
  ZSTD_compressedBlockState_t *pZVar2;
  U32 *pUVar3;
  ZSTD_cpuid_t ZVar4;
  ZSTD_cwksp local_58;
  
  if (((ulong)workspace & 7) == 0 && 0xdf8 < workspaceSize) {
    ZSTD_cwksp_init(&local_58,workspace,workspaceSize,ZSTD_cwksp_static_alloc);
    __s = local_58.objectEnd;
    if (local_58.phase != ZSTD_cwksp_alloc_objects) {
      return (ZSTD_CCtx *)0x0;
    }
    local_58.tableEnd = (void *)((long)local_58.objectEnd + 0xdf8);
    if (local_58.workspaceEnd < local_58.tableEnd) {
      return (ZSTD_CCtx *)0x0;
    }
    if ((ZSTD_CCtx *)local_58.objectEnd != (ZSTD_CCtx *)0x0) {
      local_58.objectEnd = local_58.tableEnd;
      local_58.tableValidEnd = local_58.tableEnd;
      memset(__s,0,0xdf8);
      ((ZSTD_cwksp *)((long)__s + 0x230))->tableValidEnd = local_58.tableValidEnd;
      ((ZSTD_cwksp *)((long)__s + 0x230))->allocStart = local_58.allocStart;
      ((ZSTD_cwksp *)((long)__s + 0x230))->objectEnd = local_58.objectEnd;
      ((ZSTD_cwksp *)((long)__s + 0x230))->tableEnd = local_58.tableEnd;
      ((ZSTD_cwksp *)((long)__s + 0x230))->workspace = local_58.workspace;
      ((ZSTD_cwksp *)((long)__s + 0x230))->workspaceEnd = local_58.workspaceEnd;
      pZVar1 = (ZSTD_cwksp *)((long)__s + 0x230);
      pZVar1->allocFailed = local_58.allocFailed;
      *(undefined3 *)&pZVar1->field_0x31 = local_58._49_3_;
      pZVar1->workspaceOversizedDuration = local_58.workspaceOversizedDuration;
      ((ZSTD_cwksp *)((long)__s + 0x230))->phase = local_58.phase;
      ((ZSTD_cwksp *)((long)__s + 0x230))->isStatic = local_58.isStatic;
      *(size_t *)((long)__s + 0x308) = workspaceSize;
      if ((ulong)((long)((ZSTD_cwksp *)((long)__s + 0x230))->allocStart -
                 (long)((ZSTD_cwksp *)((long)__s + 0x230))->tableEnd) < 0x3db8) {
        return (ZSTD_CCtx *)0x0;
      }
      pZVar1 = (ZSTD_cwksp *)((long)__s + 0x230);
      pZVar2 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(pZVar1,0x11f0);
      ((ZSTD_blockState_t *)((long)__s + 0xc00))->prevCBlock = pZVar2;
      pZVar2 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(pZVar1,0x11f0);
      ((ZSTD_blockState_t *)((long)__s + 0xc00))->nextCBlock = pZVar2;
      pUVar3 = (U32 *)ZSTD_cwksp_reserve_object(pZVar1,0x19d8);
      *(U32 **)((long)__s + 0xd28) = pUVar3;
      ZVar4 = ZSTD_cpuid();
      *(U32 *)((long)__s + 8) = ZVar4.f1c >> 8 & 1;
      return (ZSTD_CCtx *)__s;
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}